

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cpp
# Opt level: O1

bool curl_perform_with_retry(string *url,CURL *curl,int max_attempts,int retry_delay_seconds)

{
  int iVar1;
  int iVar2;
  common_log *pcVar3;
  undefined8 uVar4;
  int *piVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  double dVar9;
  timespec local_40;
  
  iVar7 = 3;
  do {
    iVar6 = iVar7;
    if (iVar6 < 1) {
      if (-1 < common_log_verbosity_thold) {
        pcVar3 = common_log_main();
        common_log_add(pcVar3,GGML_LOG_LEVEL_ERROR,
                       "%s: curl_easy_perform() failed after %d attempts\n",
                       "curl_perform_with_retry",3);
      }
      break;
    }
    if (-1 < common_log_verbosity_thold) {
      pcVar3 = common_log_main();
      common_log_add(pcVar3,GGML_LOG_LEVEL_INFO,
                     "%s: Trying to download from %s (attempt %d of %d)...\n",
                     "curl_perform_with_retry",(url->_M_dataplus)._M_p,(ulong)(4 - iVar6),3);
    }
    iVar1 = curl_easy_perform(curl);
    iVar7 = iVar6;
    if (iVar1 != 0) {
      dVar9 = ldexp(1.0,3 - iVar6);
      uVar8 = (uint)(dVar9 * 1000.0);
      if (-1 < common_log_verbosity_thold) {
        pcVar3 = common_log_main();
        uVar4 = curl_easy_strerror(iVar1);
        common_log_add(pcVar3,GGML_LOG_LEVEL_WARN,
                       "%s: curl_easy_perform() failed: %s, retrying after %d milliseconds...\n",
                       "curl_perform_with_retry",uVar4,(ulong)uVar8);
      }
      iVar7 = iVar6 + -1;
      if (0 < (int)uVar8) {
        local_40.tv_sec = (ulong)uVar8 / 1000;
        local_40.tv_nsec = ((ulong)uVar8 % 1000) * 1000000;
        do {
          iVar2 = nanosleep(&local_40,&local_40);
          if (iVar2 != -1) break;
          piVar5 = __errno_location();
        } while (*piVar5 == 4);
      }
    }
  } while (iVar1 != 0);
  return 0 < iVar6;
}

Assistant:

static bool curl_perform_with_retry(const std::string & url, CURL * curl, int max_attempts, int retry_delay_seconds) {
    int remaining_attempts = max_attempts;

    while (remaining_attempts > 0) {
        LOG_INF("%s: Trying to download from %s (attempt %d of %d)...\n", __func__ , url.c_str(), max_attempts - remaining_attempts + 1, max_attempts);

        CURLcode res = curl_easy_perform(curl);
        if (res == CURLE_OK) {
            return true;
        }

        int exponential_backoff_delay = std::pow(retry_delay_seconds, max_attempts - remaining_attempts) * 1000;
        LOG_WRN("%s: curl_easy_perform() failed: %s, retrying after %d milliseconds...\n", __func__, curl_easy_strerror(res), exponential_backoff_delay);

        remaining_attempts--;
        std::this_thread::sleep_for(std::chrono::milliseconds(exponential_backoff_delay));
    }

    LOG_ERR("%s: curl_easy_perform() failed after %d attempts\n", __func__, max_attempts);

    return false;
}